

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

bool __thiscall
gss::innards::HomomorphismSearcher::both_in_the_neighbourhood_of_some_vertex
          (HomomorphismSearcher *this,uint v,uint w)

{
  byte bVar1;
  SVOBitset *this_00;
  SVOBitset *in_RDI;
  SVOBitset i;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar2;
  
  uVar2 = 0;
  HomomorphismModel::pattern_graph_row
            ((HomomorphismModel *)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  SVOBitset::SVOBitset
            (in_RDI,(SVOBitset *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  this_00 = HomomorphismModel::pattern_graph_row
                      ((HomomorphismModel *)in_RDI,in_stack_ffffffffffffff3c,
                       in_stack_ffffffffffffff38);
  SVOBitset::operator&=(this_00,(SVOBitset *)CONCAT44(uVar2,in_stack_ffffffffffffff48));
  bVar1 = SVOBitset::any((SVOBitset *)CONCAT44(uVar2,in_stack_ffffffffffffff48));
  SVOBitset::~SVOBitset(in_RDI);
  return (bool)(bVar1 & 1);
}

Assistant:

auto HomomorphismSearcher::both_in_the_neighbourhood_of_some_vertex(unsigned v, unsigned w) -> bool
{
    auto i = model.pattern_graph_row(0, v);
    i &= model.pattern_graph_row(0, w);
    return i.any();
}